

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotStemsEx<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>>
               (char *label_id,GetterXsYs<double> *get_mark,GetterXsYRef<double> *get_base)

{
  ImPlotRange *pIVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar11;
  ImPlotContext *pIVar12;
  GetterXsYs<double> *getter1;
  bool bVar13;
  byte bVar14;
  ImU32 IVar15;
  long lVar16;
  long lVar17;
  byte bVar18;
  double *pdVar19;
  double *pdVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  double dVar24;
  float fVar25;
  double dVar26;
  double dVar27;
  undefined8 local_a0;
  uint local_94;
  GetterXsYRef<double> *local_90;
  float local_84;
  undefined8 local_80;
  double *local_78;
  GetterXsYs<double> *local_70;
  long local_68;
  ulong local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  uint local_40;
  float local_3c;
  ImPlotContext *local_38;
  
  bVar13 = BeginItem(label_id,0);
  pIVar12 = GImPlot;
  if (bVar13) {
    if ((GImPlot->FitThisFrame == true) && (iVar4 = get_base->Count, 0 < iVar4)) {
      local_78 = get_mark->Xs;
      local_38 = (ImPlotContext *)get_mark->Ys;
      iVar22 = get_mark->Count;
      uVar5 = get_mark->Offset;
      local_48 = (double *)(ulong)uVar5;
      local_50 = (double *)(long)get_mark->Stride;
      pIVar11 = GImPlot->CurrentPlot;
      iVar6 = pIVar11->CurrentYAxis;
      uVar7 = (pIVar11->XAxis).Flags;
      uVar8 = pIVar11->YAxis[iVar6].Flags;
      dVar2 = get_base->YRef;
      local_58 = (double *)((ulong)dVar2 & 0x7fffffffffffffff);
      pIVar1 = GImPlot->ExtentsY + iVar6;
      bVar14 = dVar2 <= 0.0 & (byte)(uVar8 >> 5) & 7;
      local_68 = CONCAT71(local_68._1_7_,bVar14);
      bVar18 = (double *)0x7fefffffffffffff < local_58 | bVar14;
      local_60 = CONCAT71(local_60._1_7_,bVar18);
      local_80 = (ImDrawList *)(CONCAT44(local_80._4_4_,uVar8) & 0xffffffff00000020);
      local_94 = uVar7 & 0x20;
      pdVar19 = get_base->Xs;
      iVar9 = get_base->Offset;
      iVar10 = get_base->Stride;
      iVar21 = 0;
      do {
        lVar16 = (long)(((int)(uVar5 + iVar21) % iVar22 + iVar22) % iVar22) * (long)local_50;
        dVar24 = *(double *)((long)local_78 + lVar16);
        dVar26 = *(double *)((long)local_38 + lVar16);
        if ((uVar7 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar24) < 0x7ff0000000000000) {
LAB_00212cc6:
            if ((0.0 < dVar24) || (local_94 == 0)) {
              dVar3 = (pIVar12->ExtentsX).Min;
              dVar27 = dVar24;
              if (dVar3 <= dVar24) {
                dVar27 = dVar3;
              }
              (pIVar12->ExtentsX).Min = dVar27;
              dVar3 = (pIVar12->ExtentsX).Max;
              dVar27 = dVar24;
              if (dVar24 <= dVar3) {
                dVar27 = dVar3;
              }
              (pIVar12->ExtentsX).Max = dVar27;
            }
          }
        }
        else if ((((ulong)ABS(dVar24) < 0x7ff0000000000000) &&
                 (pIVar11->YAxis[iVar6].Range.Min <= dVar26)) &&
                (dVar26 <= pIVar11->YAxis[iVar6].Range.Max)) goto LAB_00212cc6;
        if ((uVar8 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar26) < 0x7ff0000000000000) {
LAB_00212d30:
            if ((0.0 < dVar26) || ((int)local_80 == 0)) {
              dVar24 = dVar26;
              if (pIVar1->Min <= dVar26) {
                dVar24 = pIVar1->Min;
              }
              pIVar1->Min = dVar24;
              if (dVar26 <= pIVar1->Max) {
                dVar26 = pIVar1->Max;
              }
              pIVar1->Max = dVar26;
            }
          }
        }
        else if ((((ulong)ABS(dVar26) < 0x7ff0000000000000) &&
                 ((pIVar11->XAxis).Range.Min <= dVar24)) && (dVar24 <= (pIVar11->XAxis).Range.Max))
        goto LAB_00212d30;
        dVar24 = *(double *)
                  ((long)pdVar19 + (long)(((iVar9 + iVar21) % iVar4 + iVar4) % iVar4) * (long)iVar10
                  );
        if ((uVar7 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar24) < 0x7ff0000000000000) {
LAB_00212da8:
            if (((uVar7 & 0x20) == 0) || (0.0 < dVar24)) {
              dVar26 = (pIVar12->ExtentsX).Min;
              dVar3 = dVar24;
              if (dVar26 <= dVar24) {
                dVar3 = dVar26;
              }
              (pIVar12->ExtentsX).Min = dVar3;
              dVar26 = (pIVar12->ExtentsX).Max;
              dVar3 = dVar24;
              if (dVar24 <= dVar26) {
                dVar3 = dVar26;
              }
              (pIVar12->ExtentsX).Max = dVar3;
            }
          }
        }
        else if ((((ulong)ABS(dVar24) < 0x7ff0000000000000) &&
                 (pIVar11->YAxis[iVar6].Range.Min <= dVar2)) &&
                (dVar2 <= pIVar11->YAxis[iVar6].Range.Max)) goto LAB_00212da8;
        if ((uVar8 >> 10 & 1) == 0) {
          if (bVar18 == 0) {
LAB_00212de9:
            dVar24 = dVar2;
            if (pIVar1->Min <= dVar2) {
              dVar24 = pIVar1->Min;
            }
            pIVar1->Min = dVar24;
            dVar24 = dVar2;
            if (dVar2 <= pIVar1->Max) {
              dVar24 = pIVar1->Max;
            }
            pIVar1->Max = dVar24;
          }
        }
        else if ((local_58 < (double *)0x7ff0000000000000 && bVar14 == 0) &&
                 ((pIVar11->XAxis).Range.Min <= dVar24 && dVar24 <= (pIVar11->XAxis).Range.Max))
        goto LAB_00212de9;
        iVar21 = iVar21 + 1;
      } while (iVar4 != iVar21);
    }
    local_90 = get_base;
    local_70 = get_mark;
    local_80 = GetPlotDrawList();
    getter1 = local_70;
    if ((pIVar12->NextItemData).RenderLine == true) {
      IVar15 = ImGui::GetColorU32((pIVar12->NextItemData).Colors);
      iVar4 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar4]) {
      case 0:
        local_a0 = CONCAT44(local_a0._4_4_,iVar4);
        RenderLineSegments<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLinLin>
                  (getter1,local_90,(TransformerLinLin *)&local_a0,local_80,
                   (pIVar12->NextItemData).LineWeight,IVar15);
        break;
      case 1:
        local_a0 = CONCAT44(local_a0._4_4_,iVar4);
        RenderLineSegments<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLogLin>
                  (getter1,local_90,(TransformerLogLin *)&local_a0,local_80,
                   (pIVar12->NextItemData).LineWeight,IVar15);
        break;
      case 2:
        local_a0 = CONCAT44(local_a0._4_4_,iVar4);
        RenderLineSegments<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLinLog>
                  (getter1,local_90,(TransformerLinLog *)&local_a0,local_80,
                   (pIVar12->NextItemData).LineWeight,IVar15);
        break;
      case 3:
        local_a0 = CONCAT44(local_a0._4_4_,iVar4);
        RenderLineSegments<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLogLog>
                  (getter1,local_90,(TransformerLogLog *)&local_a0,local_80,
                   (pIVar12->NextItemData).LineWeight,IVar15);
      }
    }
    iVar4 = (pIVar12->NextItemData).Marker;
    iVar22 = 0;
    if (iVar4 != -1) {
      iVar22 = iVar4;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar12->NextItemData).MarkerSize);
    local_94 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 2);
    IVar15 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 3);
    local_90 = (GetterXsYRef<double> *)CONCAT44(local_90._4_4_,IVar15);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    lVar16 = (long)transformer.YAxis;
    local_38 = GImPlot;
    local_78 = (double *)lVar16;
    switch(GImPlot->Scales[lVar16]) {
    case 0:
      iVar4 = getter1->Count;
      if (0 < iVar4) {
        pdVar19 = getter1->Xs;
        pdVar20 = getter1->Ys;
        iVar6 = getter1->Offset;
        local_58 = (double *)CONCAT44(local_58._4_4_,(pIVar12->NextItemData).MarkerSize);
        local_60 = CONCAT44(local_60._4_4_,(pIVar12->NextItemData).MarkerWeight);
        iVar9 = getter1->Stride;
        local_68 = (long)iVar22;
        iVar22 = 0;
        local_70 = (GetterXsYs<double> *)
                   CONCAT44(local_70._4_4_,(uint)(pIVar12->NextItemData).RenderMarkerLine);
        local_84 = (float)(uint)(pIVar12->NextItemData).RenderMarkerFill;
        local_50 = pdVar19;
        local_48 = pdVar20;
        do {
          lVar17 = (long)(((iVar6 + iVar22) % iVar4 + iVar4) % iVar4) * (long)iVar9;
          fVar23 = (float)((*(double *)((long)pdVar19 + lVar17) -
                           (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                          (double)GImPlot->PixelRange[lVar16].Min.x);
          fVar25 = (float)((*(double *)((long)pdVar20 + lVar17) -
                           GImPlot->CurrentPlot->YAxis[lVar16].Range.Min) *
                           GImPlot->My[(long)local_78] + (double)GImPlot->PixelRange[lVar16].Min.y);
          local_a0 = CONCAT44(fVar25,fVar23);
          pIVar11 = local_38->CurrentPlot;
          if ((((pIVar11->PlotRect).Min.x <= fVar23) && ((pIVar11->PlotRect).Min.y <= fVar25)) &&
             ((fVar23 < (pIVar11->PlotRect).Max.x && (fVar25 < (pIVar11->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_68 * 8))
                      (local_80,&local_a0,(ulong)local_70 & 0xffffffff,local_94,local_84,
                       (ulong)local_90 & 0xffffffff);
            pdVar19 = local_50;
            pdVar20 = local_48;
          }
          iVar22 = iVar22 + 1;
        } while (iVar4 != iVar22);
      }
      break;
    case 1:
      iVar4 = getter1->Count;
      if (0 < iVar4) {
        local_50 = getter1->Xs;
        local_58 = getter1->Ys;
        local_60 = (ulong)(uint)getter1->Offset;
        local_84 = (pIVar12->NextItemData).MarkerSize;
        local_3c = (pIVar12->NextItemData).MarkerWeight;
        local_68 = (long)getter1->Stride;
        local_70 = (GetterXsYs<double> *)(long)iVar22;
        iVar22 = 0;
        local_40 = (uint)(pIVar12->NextItemData).RenderMarkerLine;
        bVar13 = (pIVar12->NextItemData).RenderMarkerFill;
        do {
          pIVar12 = GImPlot;
          lVar17 = ((((int)local_60 + iVar22) % iVar4 + iVar4) % iVar4) * local_68;
          local_48 = *(double **)((long)local_58 + lVar17);
          dVar24 = log10(*(double *)((long)local_50 + lVar17) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar11 = pIVar12->CurrentPlot;
          dVar2 = (pIVar11->XAxis).Range.Min;
          fVar23 = (float)((((double)(float)(dVar24 / pIVar12->LogDenX) *
                             ((pIVar11->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar12->Mx +
                          (double)pIVar12->PixelRange[lVar16].Min.x);
          fVar25 = (float)(((double)local_48 - pIVar11->YAxis[lVar16].Range.Min) *
                           pIVar12->My[(long)local_78] + (double)pIVar12->PixelRange[lVar16].Min.y);
          local_a0 = CONCAT44(fVar25,fVar23);
          pIVar11 = local_38->CurrentPlot;
          if (((((pIVar11->PlotRect).Min.x <= fVar23) && ((pIVar11->PlotRect).Min.y <= fVar25)) &&
              (fVar23 < (pIVar11->PlotRect).Max.x)) && (fVar25 < (pIVar11->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_70 * 8))
                      (local_80,&local_a0,local_40,local_94,bVar13,(ulong)local_90 & 0xffffffff);
          }
          iVar22 = iVar22 + 1;
        } while (iVar4 != iVar22);
      }
      break;
    case 2:
      iVar4 = getter1->Count;
      if (0 < iVar4) {
        local_50 = getter1->Xs;
        local_58 = getter1->Ys;
        local_60 = (ulong)(uint)getter1->Offset;
        local_84 = (pIVar12->NextItemData).MarkerSize;
        local_3c = (pIVar12->NextItemData).MarkerWeight;
        local_68 = (long)getter1->Stride;
        local_70 = (GetterXsYs<double> *)(long)iVar22;
        iVar22 = 0;
        local_40 = (uint)(pIVar12->NextItemData).RenderMarkerLine;
        bVar13 = (pIVar12->NextItemData).RenderMarkerFill;
        do {
          pIVar12 = GImPlot;
          lVar17 = ((((int)local_60 + iVar22) % iVar4 + iVar4) % iVar4) * local_68;
          local_48 = *(double **)((long)local_50 + lVar17);
          dVar24 = log10(*(double *)((long)local_58 + lVar17) /
                         GImPlot->CurrentPlot->YAxis[lVar16].Range.Min);
          pIVar11 = pIVar12->CurrentPlot;
          dVar2 = pIVar11->YAxis[lVar16].Range.Min;
          fVar25 = (float)(((double)local_48 - (pIVar11->XAxis).Range.Min) * pIVar12->Mx +
                          (double)pIVar12->PixelRange[lVar16].Min.x);
          fVar23 = (float)((((double)(float)(dVar24 / pIVar12->LogDenY[(long)local_78]) *
                             (pIVar11->YAxis[lVar16].Range.Max - dVar2) + dVar2) - dVar2) *
                           pIVar12->My[(long)local_78] + (double)pIVar12->PixelRange[lVar16].Min.y);
          local_a0 = CONCAT44(fVar23,fVar25);
          pIVar11 = local_38->CurrentPlot;
          if ((((pIVar11->PlotRect).Min.x <= fVar25) && ((pIVar11->PlotRect).Min.y <= fVar23)) &&
             ((fVar25 < (pIVar11->PlotRect).Max.x && (fVar23 < (pIVar11->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_70 * 8))
                      (local_80,&local_a0,local_40,local_94,bVar13,(ulong)local_90 & 0xffffffff);
          }
          iVar22 = iVar22 + 1;
        } while (iVar4 != iVar22);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<double>>
                (*getter1,transformer,local_80,iVar22,(pIVar12->NextItemData).MarkerSize,
                 (pIVar12->NextItemData).RenderMarkerLine,local_94,
                 (pIVar12->NextItemData).MarkerWeight,(pIVar12->NextItemData).RenderMarkerFill,
                 IVar15);
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}